

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O1

bool cppwinrt::implements_interface(TypeDef *type,string_view *name)

{
  bool bVar1;
  bool bVar2;
  uint32_t row;
  TypeDef TVar3;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_a8;
  coded_index<winmd::reader::TypeDefOrRef> local_88;
  type_name local_78;
  table_base *local_50;
  uint32_t local_48;
  table_base *local_40;
  uint32_t local_38;
  
  local_a8.first._M_len =
       CONCAT44(local_a8.first._M_len._4_4_,
                (type->super_row_base<winmd::reader::TypeDef>).m_index + 1);
  winmd::reader::
  equal_range<winmd::reader::table<winmd::reader::InterfaceImpl>,unsigned_int,winmd::reader::TypeDef::InterfaceImpl()const::compare>
            (&local_50,
             (reader *)
             &((type->super_row_base<winmd::reader::TypeDef>).m_table)->m_database->InterfaceImpl);
  bVar2 = local_48 == local_38 && local_50 == local_40;
  if (local_48 != local_38 || local_50 != local_40) {
    row = local_48;
    do {
      local_88.super_typed_index<winmd::reader::TypeDefOrRef>.
      super_index_base<winmd::reader::TypeDefOrRef>.m_value =
           winmd::reader::table_base::get_value<unsigned_int>(local_50,row,1);
      local_88.super_typed_index<winmd::reader::TypeDefOrRef>.
      super_index_base<winmd::reader::TypeDefOrRef>.m_table = local_50;
      if ((local_88.super_typed_index<winmd::reader::TypeDefOrRef>.
           super_index_base<winmd::reader::TypeDefOrRef>.m_value & 3) != 2) {
        local_78.name_space._M_len = 0;
        local_78.name_space._M_str = (char *)0x0;
        local_78.name._M_len = 0;
        local_78.name._M_str = (char *)0x0;
        winmd::reader::get_type_namespace_and_name(&local_a8,&local_88);
        local_78.name_space._M_len = local_a8.first._M_len;
        local_78.name._M_len = local_a8.second._M_len;
        local_78.name._M_str = local_a8.second._M_str;
        bVar1 = operator==(&local_78,name);
        if (bVar1) {
          if (!bVar2) {
            return true;
          }
          break;
        }
      }
      bVar1 = local_38 - 1 == row;
      row = row + 1;
      bVar2 = bVar1 && local_50 == local_40;
    } while (!bVar1 || local_50 != local_40);
  }
  TVar3 = get_base_class(type);
  local_a8.first._M_len = (size_t)TVar3.super_row_base<winmd::reader::TypeDef>.m_table;
  local_a8.first._M_str._0_4_ = TVar3.super_row_base<winmd::reader::TypeDef>.m_index;
  if ((table_base *)local_a8.first._M_len == (table_base *)0x0) {
    bVar2 = false;
  }
  else {
    bVar2 = implements_interface((TypeDef *)&local_a8,name);
  }
  return bVar2;
}

Assistant:

static bool implements_interface(TypeDef const& type, std::string_view const& name)
    {
        for (auto&& impl : type.InterfaceImpl())
        {
            const auto iface = impl.Interface();
            if (iface.type() != TypeDefOrRef::TypeSpec && type_name(iface) == name)
            {
                return true;
            }
        }

        if (auto base = get_base_class(type))
        {
            return implements_interface(base, name);
        }
        else
        {
            return false;
        }
    }